

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

bool __thiscall
Js::InlineCache::GetGetterSetter
          (InlineCache *this,RecyclableObject *object,RecyclableObject **callee)

{
  Type *pTVar1;
  DynamicObject *pDVar2;
  Var pvVar3;
  RecyclableObject *pRVar4;
  Type *taggedType;
  Type *type;
  RecyclableObject **callee_local;
  RecyclableObject *object_local;
  InlineCache *this_local;
  
  *callee = (RecyclableObject *)0x0;
  if (((this->u).accessor.field_1.rawUInt16 >> 1 & 3) != 0) {
    pTVar1 = RecyclableObject::GetType(object);
    callee_local = (RecyclableObject **)object;
    if (((this->u).accessor.field_1.rawUInt16 >> 3 & 1) != 0) {
      callee_local = (RecyclableObject **)(this->u).local.type;
    }
    if (pTVar1 == (Type *)(this->u).proto.prototypeObject) {
      pDVar2 = VarTo<Js::DynamicObject,Js::RecyclableObject>((RecyclableObject *)callee_local);
      pvVar3 = DynamicObject::GetInlineSlot(pDVar2,(uint)(this->u).accessor.slotIndex);
      pRVar4 = VarTo<Js::RecyclableObject>(pvVar3);
      *callee = pRVar4;
      return true;
    }
    if ((DynamicObject *)((ulong)pTVar1 | 4) == (this->u).proto.prototypeObject) {
      pDVar2 = VarTo<Js::DynamicObject,Js::RecyclableObject>((RecyclableObject *)callee_local);
      pvVar3 = DynamicObject::GetAuxSlot(pDVar2,(uint)(this->u).accessor.slotIndex);
      pRVar4 = VarTo<Js::RecyclableObject>(pvVar3);
      *callee = pRVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool InlineCache::GetGetterSetter(RecyclableObject *object, RecyclableObject **callee)
    {
        *callee = nullptr;

        if (u.accessor.flags & (InlineCacheGetterFlag | InlineCacheSetterFlag))
        {
            Type *type = object->GetType();
            Type *const taggedType = TypeWithAuxSlotTag(type);
            if (u.accessor.isOnProto)
            {
               object = u.accessor.object;
            }

            if (type == u.accessor.type)
            {
                *callee = VarTo<RecyclableObject>(VarTo<DynamicObject>(object)->GetInlineSlot(u.accessor.slotIndex));
                return true;
            }
            else if (taggedType == u.accessor.type)
            {
                *callee = VarTo<RecyclableObject>(VarTo<DynamicObject>(object)->GetAuxSlot(u.accessor.slotIndex));
                return true;
            }
        }
        return false;
    }